

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ExpressionBinder::QualifyColumnName
          (ExpressionBinder *this,string *column_name,ErrorData *error)

{
  pointer pBVar1;
  bool bVar2;
  UsingColumnSet *pUVar3;
  optional_ptr<duckdb::Binding,_true> oVar4;
  DummyBinding *pDVar5;
  pointer pOVar6;
  BinderException *this_00;
  ErrorData *in_RCX;
  pointer args_1;
  long lVar7;
  optional_ptr<duckdb::UsingColumnSet,_true> using_binding;
  BinderException local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  similar_bindings;
  undefined1 local_c0 [8];
  optional_ptr<duckdb::Binding,_true> table_binding;
  ErrorData local_b0;
  
  using_binding =
       BindContext::GetUsingBinding
                 ((BindContext *)(*(long *)((long)&column_name[1].field_2 + 8) + 0x88),
                  (string *)error);
  if (using_binding.ptr != (UsingColumnSet *)0x0) {
    pUVar3 = optional_ptr<duckdb::UsingColumnSet,_true>::operator->(&using_binding);
    bVar2 = BindingAlias::IsSet(&pUVar3->primary_binding);
    if (bVar2) {
      lVar7 = *(long *)((long)&column_name[1].field_2 + 8);
      pUVar3 = optional_ptr<duckdb::UsingColumnSet,_true>::operator->(&using_binding);
      BindContext::CreateColumnReference
                ((BindContext *)this,(BindingAlias *)(lVar7 + 0x88),(string *)pUVar3,
                 (ColumnBindType)error);
      return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              )this;
    }
    similar_bindings.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(similar_bindings.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x98);
    make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>
              ((duckdb *)&local_b0,(ExpressionType *)&similar_bindings);
    pOVar6 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                           *)&local_b0);
    pUVar3 = optional_ptr<duckdb::UsingColumnSet,_true>::operator->(&using_binding);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::reserve(&(pOVar6->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ,((long)(pUVar3->bindings).
                      super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pUVar3->bindings).
                     super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                     super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x60);
    pUVar3 = optional_ptr<duckdb::UsingColumnSet,_true>::operator->(&using_binding);
    pBVar1 = (pUVar3->bindings).
             super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
             super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (args_1 = (pUVar3->bindings).
                  super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                  super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_c0 = (undefined1  [8])local_b0._0_8_, args_1 != pBVar1; args_1 = args_1 + 1) {
      pOVar6 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
               ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                             *)&local_b0);
      make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string_const&,duckdb::BindingAlias&>
                ((duckdb *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error,args_1);
      similar_bindings.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f0.super_Exception._0_8_;
      local_f0.super_Exception._0_8_ = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pOVar6->children,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&similar_bindings);
      if (similar_bindings.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((similar_bindings.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
      similar_bindings.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if ((pointer)local_f0.super_Exception._0_8_ != (pointer)0x0) {
        (**(code **)(((_Alloc_hider *)local_f0.super_Exception._0_8_)->_M_p + 8))();
      }
    }
LAB_015eb354:
    this->_vptr_ExpressionBinder = (_func_int **)local_c0;
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            )this;
  }
  LambdaRefExpression::FindMatchingBinding
            ((LambdaRefExpression *)local_c0,
             (optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *)
             &column_name[1]._M_string_length,(string *)error);
  if (local_c0 != (undefined1  [8])0x0) goto LAB_015eb354;
  oVar4 = BindContext::GetMatchingBinding
                    ((BindContext *)(*(long *)((long)&column_name[1].field_2 + 8) + 0x88),
                     (string *)error);
  lVar7 = *(long *)((long)&column_name[1].field_2 + 8);
  table_binding = oVar4;
  if (*(long *)(lVar7 + 0x1a8) == 0) {
LAB_015eb371:
    if (oVar4.ptr == (Binding *)0x0) {
      BindContext::GetSimilarBindings
                (&similar_bindings,
                 (BindContext *)(*(long *)((long)&column_name[1].field_2 + 8) + 0x88),
                 (string *)error);
      BinderException::ColumnNotFound
                (&local_f0,(string *)error,&similar_bindings,(QueryErrorContext)0xffffffffffffffff);
      ErrorData::ErrorData(&local_b0,(exception *)&local_f0);
      ErrorData::operator=(in_RCX,&local_b0);
      ErrorData::~ErrorData(&local_b0);
      ::std::runtime_error::~runtime_error((runtime_error *)&local_f0);
      this->_vptr_ExpressionBinder = (_func_int **)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&similar_bindings);
      goto LAB_015eb418;
    }
    lVar7 = *(long *)((long)&column_name[1].field_2 + 8);
    pDVar5 = (DummyBinding *)optional_ptr<duckdb::Binding,_true>::operator->(&table_binding);
  }
  else {
    pDVar5 = optional_ptr<duckdb::DummyBinding,_true>::operator->
                       ((optional_ptr<duckdb::DummyBinding,_true> *)(lVar7 + 0x1a8));
    bVar2 = Binding::HasMatchingBinding(&pDVar5->super_Binding,(string *)error);
    if (!bVar2) goto LAB_015eb371;
    if (oVar4.ptr != (Binding *)0x0) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &similar_bindings,"Conflicting column names for column ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &similar_bindings,"!");
      BinderException::BinderException(this_00,(string *)&local_b0);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar7 = *(long *)((long)&column_name[1].field_2 + 8);
    pDVar5 = optional_ptr<duckdb::DummyBinding,_true>::operator->
                       ((optional_ptr<duckdb::DummyBinding,_true> *)(lVar7 + 0x1a8));
  }
  BindContext::CreateColumnReference
            ((BindContext *)this,(BindingAlias *)(lVar7 + 0x88),
             &(pDVar5->super_Binding).alias.catalog,(ColumnBindType)error);
LAB_015eb418:
  if (local_c0 == (undefined1  [8])0x0) {
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            )this;
  }
  (**(code **)(*(_func_int **)local_c0 + 8))();
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>)
         this;
}

Assistant:

unique_ptr<ParsedExpression> ExpressionBinder::QualifyColumnName(const string &column_name, ErrorData &error) {
	auto using_binding = binder.bind_context.GetUsingBinding(column_name);
	if (using_binding) {
		// we are referencing a USING column
		// check if we can refer to one of the base columns directly
		unique_ptr<Expression> expression;
		if (using_binding->primary_binding.IsSet()) {
			// we can! just assign the table name and re-bind
			return binder.bind_context.CreateColumnReference(using_binding->primary_binding, column_name);
		} else {
			// we cannot! we need to bind this as COALESCE between all the relevant columns
			auto coalesce = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_COALESCE);
			coalesce->children.reserve(using_binding->bindings.size());
			for (auto &entry : using_binding->bindings) {
				coalesce->children.push_back(make_uniq<ColumnRefExpression>(column_name, entry));
			}
			return std::move(coalesce);
		}
	}

	// try binding as a lambda parameter
	auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, column_name);
	if (lambda_ref) {
		return lambda_ref;
	}

	// find a table binding that contains this column name
	auto table_binding = binder.bind_context.GetMatchingBinding(column_name);

	// throw an error if a macro parameter name conflicts with a column name
	auto is_macro_column = false;
	if (binder.macro_binding && binder.macro_binding->HasMatchingBinding(column_name)) {
		is_macro_column = true;
		if (table_binding) {
			throw BinderException("Conflicting column names for column " + column_name + "!");
		}
	}

	// bind as a macro column
	if (is_macro_column) {
		return binder.bind_context.CreateColumnReference(binder.macro_binding->alias, column_name);
	}

	// bind as a regular column
	if (table_binding) {
		return binder.bind_context.CreateColumnReference(table_binding->alias, column_name);
	}

	// it's not, find candidates and error
	auto similar_bindings = binder.bind_context.GetSimilarBindings(column_name);
	error = ErrorData(BinderException::ColumnNotFound(column_name, similar_bindings));
	return nullptr;
}